

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O3

char * parse_headers(char *buf,char *buf_end,phr_header *headers,size_t *num_headers,
                    size_t max_headers,int *ret)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  char *pcVar4;
  long lVar5;
  size_t value_len;
  char *value;
  size_t local_40;
  char *local_38;
  
  if (buf != buf_end) {
    do {
      bVar1 = *buf;
      if (bVar1 == 10) {
        return (char *)((byte *)buf + 1);
      }
      if (bVar1 == 0xd) {
        if ((byte *)buf + 1 != (byte *)buf_end) {
          if (((byte *)buf)[1] == 10) {
            return (char *)((byte *)buf + 2);
          }
LAB_00108551:
          *ret = -1;
          return (char *)0x0;
        }
        break;
      }
      sVar2 = *num_headers;
      if (sVar2 == max_headers) goto LAB_00108551;
      if ((sVar2 == 0) || ((bVar1 != 9 && (bVar1 != 0x20)))) {
        headers[sVar2].name = buf;
        lVar5 = 0;
        pbVar3 = (byte *)buf;
        while ((ulong)*pbVar3 != 0x3a) {
          if (""[*pbVar3] == '\0') goto LAB_00108551;
          pbVar3 = pbVar3 + 1;
          lVar5 = lVar5 + -1;
          if (pbVar3 == (byte *)buf_end) goto LAB_00108548;
        }
        headers[sVar2].name_len = -lVar5;
        if (lVar5 == 0) goto LAB_00108551;
        buf = (char *)((byte *)buf + -lVar5);
        do {
          buf = (char *)((byte *)buf + 1);
          if (buf == buf_end) goto LAB_00108548;
        } while ((*buf == 0x20) || (*buf == 9));
      }
      else {
        headers[sVar2].name = (char *)0x0;
        headers[sVar2].name_len = 0;
      }
      buf = get_token_to_eol(buf,buf_end,&local_38,&local_40,ret);
      sVar2 = local_40;
      if ((byte *)buf == (byte *)0x0) {
        return (char *)0x0;
      }
      for (; pcVar4 = local_38, sVar2 != 0; sVar2 = sVar2 - 1) {
        if ((local_38[sVar2 - 1] != ' ') && (local_38[sVar2 - 1] != '\t')) {
          pcVar4 = local_38 + sVar2;
          break;
        }
      }
      sVar2 = *num_headers;
      headers[sVar2].value = local_38;
      headers[sVar2].value_len = (long)pcVar4 - (long)local_38;
      *num_headers = *num_headers + 1;
    } while (buf != buf_end);
  }
LAB_00108548:
  *ret = -2;
  return (char *)0x0;
}

Assistant:

static const char *parse_headers(const char *buf, const char *buf_end, struct phr_header *headers, size_t *num_headers,
                                 size_t max_headers, int *ret)
{
    for (;; ++*num_headers) {
        CHECK_EOF();
        if (*buf == '\015') {
            ++buf;
            EXPECT_CHAR('\012');
            break;
        } else if (*buf == '\012') {
            ++buf;
            break;
        }
        if (*num_headers == max_headers) {
            *ret = -1;
            return NULL;
        }
        if (!(*num_headers != 0 && (*buf == ' ' || *buf == '\t'))) {
            /* parsing name, but do not discard SP before colon, see
             * http://www.mozilla.org/security/announce/2006/mfsa2006-33.html */
            headers[*num_headers].name = buf;
            static const char ALIGNED(16) ranges1[] = "\x00 "  /* control chars and up to SP */
                                                      "\"\""   /* 0x22 */
                                                      "()"     /* 0x28,0x29 */
                                                      ",,"     /* 0x2c */
                                                      "//"     /* 0x2f */
                                                      ":@"     /* 0x3a-0x40 */
                                                      "[]"     /* 0x5b-0x5d */
                                                      "{\377"; /* 0x7b-0xff */
            int found;
            buf = findchar_fast(buf, buf_end, ranges1, sizeof(ranges1) - 1, &found);
            if (!found) {
                CHECK_EOF();
            }
            while (1) {
                if (*buf == ':') {
                    break;
                } else if (!token_char_map[(unsigned char)*buf]) {
                    *ret = -1;
                    return NULL;
                }
                ++buf;
                CHECK_EOF();
            }
            if ((headers[*num_headers].name_len = buf - headers[*num_headers].name) == 0) {
                *ret = -1;
                return NULL;
            }
            ++buf;
            for (;; ++buf) {
                CHECK_EOF();
                if (!(*buf == ' ' || *buf == '\t')) {
                    break;
                }
            }
        } else {
            headers[*num_headers].name = NULL;
            headers[*num_headers].name_len = 0;
        }
        const char *value;
        size_t value_len;
        if ((buf = get_token_to_eol(buf, buf_end, &value, &value_len, ret)) == NULL) {
            return NULL;
        }
        /* remove trailing SPs and HTABs */
        const char *value_end = value + value_len;
        for (; value_end != value; --value_end) {
            const char c = *(value_end - 1);
            if (!(c == ' ' || c == '\t')) {
                break;
            }
        }
        headers[*num_headers].value = value;
        headers[*num_headers].value_len = value_end - value;
    }
    return buf;
}